

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.h
# Opt level: O1

void __thiscall TTD::FileWriter::WriteRawByteBuff_Fixed<unsigned_char>(FileWriter *this,uchar *data)

{
  byte *dst;
  ulong uVar1;
  
  dst = ReserveSpaceForSmallData<1ul>(this);
  js_memcpy_s(dst,1,data,1);
  uVar1 = this->m_cursor + 1;
  if (uVar1 < 0x200000) {
    this->m_cursor = uVar1;
    return;
  }
  TTDAbort_unrecoverable_error("Must have already reserved the space!");
}

Assistant:

void WriteRawByteBuff_Fixed(const T& data)
        {
            byte* trgt = this->ReserveSpaceForSmallData<sizeof(T)>();

            js_memcpy_s(trgt, sizeof(T), (const byte*)(&data), sizeof(T));

            this->CommitSpaceForSmallData(sizeof(T));
        }